

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

int Ivy_ManResetLevels_rec(Ivy_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = *(uint *)&pObj->field_0x8;
  if ((((uVar1 < 0x800) && (uVar3 = uVar1 & 0xf, uVar3 != 1)) && (uVar3 != 4)) && (pObj->Id != 0)) {
    if (uVar3 == 7) {
      uVar1 = Ivy_ManResetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | uVar1 << 0xb;
    }
    else {
      if (uVar3 - 7 < 0xfffffffe) {
        __assert_fail("Ivy_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                      ,0x113,"int Ivy_ManResetLevels_rec(Ivy_Obj_t *)");
      }
      Ivy_ManResetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Ivy_ManResetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      uVar2 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (*(uint *)(uVar4 + 8) >> 0xb < *(uint *)(uVar2 + 8) >> 0xb) {
        uVar4 = uVar2;
      }
      uVar3 = (uint)((*(uint *)&pObj->field_0x8 & 0xf) == 6) + (*(uint *)(uVar4 + 8) >> 0xb) + 1;
      uVar1 = uVar3 & 0x1fffff;
      *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | uVar3 * 0x800;
    }
  }
  else {
    uVar1 = uVar1 >> 0xb;
  }
  return uVar1;
}

Assistant:

int Ivy_ManResetLevels_rec( Ivy_Obj_t * pObj )
{
    if ( pObj->Level || Ivy_ObjIsCi(pObj) || Ivy_ObjIsConst1(pObj) )
        return pObj->Level;
    if ( Ivy_ObjIsBuf(pObj) )
        return pObj->Level = Ivy_ManResetLevels_rec( Ivy_ObjFanin0(pObj) );
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManResetLevels_rec( Ivy_ObjFanin0(pObj) );
    Ivy_ManResetLevels_rec( Ivy_ObjFanin1(pObj) );
    return pObj->Level = Ivy_ObjLevelNew( pObj );
}